

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_add(secp256k1_fe *r,secp256k1_fe *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  secp256k1_fe *psVar5;
  int64_t iVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *puVar11;
  secp256k1_fe *psVar12;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  secp256k1_modinv64_signed62 *psVar17;
  secp256k1_fe *psVar18;
  secp256k1_modinv64_signed62 *psVar19;
  uint uVar20;
  ulong *extraout_RDX;
  secp256k1_fe *psVar21;
  long lVar22;
  long lVar23;
  secp256k1_fe *psVar24;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_09;
  long lVar25;
  secp256k1_modinv64_signed62 *b;
  secp256k1_fe *psVar26;
  secp256k1_fe *unaff_RBP;
  secp256k1_fe *psVar27;
  ulong uVar28;
  long lVar29;
  secp256k1_fe *a_01;
  secp256k1_fe *psVar30;
  secp256k1_fe *psVar31;
  uint64_t uVar32;
  secp256k1_fe *psVar33;
  secp256k1_fe *psVar34;
  secp256k1_fe *unaff_R12;
  secp256k1_fe *psVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  secp256k1_modinv64_signed62 *psVar39;
  bool bVar40;
  secp256k1_modinv64_signed62 sStack_258;
  secp256k1_modinv64_signed62 sStack_230;
  secp256k1_fe *psStack_208;
  secp256k1_fe *psStack_200;
  secp256k1_modinv64_signed62 *psStack_1f8;
  ulong uStack_1f0;
  secp256k1_fe *psStack_1e8;
  ulong uStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_modinv64_signed62 *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  secp256k1_fe *psStack_1b0;
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  uint64_t uStack_198;
  uint64_t uStack_190;
  uint64_t uStack_188;
  secp256k1_fe *psStack_180;
  secp256k1_fe *psStack_178;
  secp256k1_fe *psStack_170;
  secp256k1_fe *psStack_168;
  secp256k1_fe *psStack_160;
  long lStack_158;
  secp256k1_fe *psStack_150;
  code *pcStack_148;
  uint uStack_13c;
  ulong uStack_138;
  secp256k1_fe *apsStack_130 [2];
  secp256k1_fe sStack_120;
  secp256k1_fe sStack_f0;
  secp256k1_modinv64_trans2x2 sStack_c0;
  secp256k1_fe sStack_a0;
  secp256k1_modinv64_signed62 sStack_70;
  secp256k1_fe *psStack_48;
  
  psVar26 = a;
  secp256k1_fe_verify(r);
  psVar21 = a;
  secp256k1_fe_verify(a);
  iVar4 = a->magnitude + r->magnitude;
  if (iVar4 < 0x21) {
    r->n[0] = r->n[0] + a->n[0];
    r->n[1] = r->n[1] + a->n[1];
    r->n[2] = r->n[2] + a->n[2];
    r->n[3] = r->n[3] + a->n[3];
    r->n[4] = r->n[4] + a->n[4];
    r->magnitude = iVar4;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_add_cold_1();
  sStack_a0.n[2] = 0;
  sStack_a0.n[3] = 0;
  sStack_a0.n[0] = 0;
  sStack_a0.n[1] = 0;
  sStack_a0.n[4] = 0;
  sStack_70.v[3] = 0;
  sStack_70.v[4] = 0;
  sStack_70.v[1] = 0;
  sStack_70.v[2] = 0;
  sStack_70.v[0] = 1;
  sStack_120.n[4] = psVar26->n[4];
  sStack_120.n[0] = psVar26->n[0];
  sStack_120.n[1] = psVar26->n[1];
  sStack_120.n[2] = psVar26->n[2];
  sStack_120.n[3] = psVar26->n[3];
  sStack_f0.n[4] = psVar21->n[4];
  sStack_f0.n[0] = psVar21->n[0];
  sStack_f0.n[1] = psVar21->n[1];
  sStack_f0.n[2] = psVar21->n[2];
  sStack_f0.n[3] = psVar21->n[3];
  uStack_138 = 0;
  lVar38 = -1;
  uStack_13c = 5;
  apsStack_130[0] = psVar21;
  apsStack_130[1] = psVar26;
  psStack_48 = r;
LAB_00149138:
  psVar26 = (secp256k1_fe *)sStack_120.n[0];
  psVar18 = apsStack_130[1];
  psVar5 = (secp256k1_fe *)0x0;
  psVar31 = (secp256k1_fe *)0x0;
  psVar30 = (secp256k1_fe *)0x1;
  uVar20 = 0x3e;
  psVar27 = (secp256k1_fe *)0x1;
  uVar32 = sStack_f0.n[0];
  psVar21 = (secp256k1_fe *)sStack_120.n[0];
  while( true ) {
    a_01 = (secp256k1_fe *)(-1L << ((byte)uVar20 & 0x3f) | uVar32);
    psVar17 = (secp256k1_modinv64_signed62 *)0x0;
    if (a_01 != (secp256k1_fe *)0x0) {
      for (; ((ulong)a_01 >> (long)psVar17 & 1) == 0;
          psVar17 = (secp256k1_modinv64_signed62 *)((long)psVar17->v + 1)) {
      }
    }
    bVar15 = (byte)psVar17;
    psVar33 = (secp256k1_fe *)(uVar32 >> (bVar15 & 0x3f));
    psVar27 = (secp256k1_fe *)((long)psVar27 << (bVar15 & 0x3f));
    psVar5 = (secp256k1_fe *)((long)psVar5 << (bVar15 & 0x3f));
    lVar38 = lVar38 - (long)psVar17;
    uVar20 = uVar20 - (int)psVar17;
    if (uVar20 == 0) break;
    if (((ulong)psVar21 & 1) == 0) {
      pcStack_148 = (code *)0x1495b5;
      secp256k1_modinv64_var_cold_8();
LAB_001495b5:
      pcStack_148 = (code *)0x1495ba;
      secp256k1_modinv64_var_cold_7();
LAB_001495ba:
      pcStack_148 = (code *)0x1495bf;
      secp256k1_modinv64_var_cold_1();
LAB_001495bf:
      pcStack_148 = (code *)0x1495c4;
      secp256k1_modinv64_var_cold_2();
LAB_001495c4:
      pcStack_148 = (code *)0x1495c9;
      secp256k1_modinv64_var_cold_6();
      psVar33 = psVar21;
      goto LAB_001495c9;
    }
    if (((ulong)psVar33 & 1) == 0) goto LAB_001495b5;
    a_01 = (secp256k1_fe *)((long)psVar5 * sStack_f0.n[0] + (long)psVar27 * sStack_120.n[0]);
    psVar17 = (secp256k1_modinv64_signed62 *)(ulong)(0x3e - uVar20);
    bVar15 = (byte)(0x3e - uVar20);
    r = (secp256k1_fe *)((long)psVar21 << (bVar15 & 0x3f));
    if (a_01 != r) goto LAB_001495ba;
    r = (secp256k1_fe *)((long)psVar30 * sStack_f0.n[0] + (long)psVar31 * sStack_120.n[0]);
    a_01 = (secp256k1_fe *)((long)psVar33 << (bVar15 & 0x3f));
    if (r != a_01) goto LAB_001495bf;
    psVar17 = (secp256k1_modinv64_signed62 *)(lVar38 - 0x2ea);
    if (psVar17 < (secp256k1_modinv64_signed62 *)0xfffffffffffffa2d) goto LAB_001495c4;
    iVar4 = (int)psVar33;
    if (lVar38 < 0) {
      lVar38 = -lVar38;
      uVar16 = (int)lVar38 + 1;
      if ((int)uVar20 <= (int)uVar16) {
        uVar16 = uVar20;
      }
      psVar17 = (secp256k1_modinv64_signed62 *)(ulong)uVar16;
      a_01 = (secp256k1_fe *)(ulong)(uVar16 - 0x3f);
      if (0xffffffc1 < uVar16 - 0x3f) {
        psVar12 = (secp256k1_fe *)-(long)psVar5;
        unaff_RBP = (secp256k1_fe *)-(long)psVar27;
        psVar24 = (secp256k1_fe *)-(long)psVar21;
        r = (secp256k1_fe *)((ulong)(0x3fL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
        uVar16 = (iVar4 * iVar4 + 0x3e) * iVar4 * (int)psVar24 & (uint)r;
        psVar5 = psVar30;
        psVar27 = psVar31;
        unaff_R12 = psVar12;
        goto LAB_00149294;
      }
      goto LAB_001495d3;
    }
    uVar16 = (int)lVar38 + 1;
    if ((int)uVar20 <= (int)uVar16) {
      uVar16 = uVar20;
    }
    psVar17 = (secp256k1_modinv64_signed62 *)(ulong)uVar16;
    a_01 = (secp256k1_fe *)(ulong)(uVar16 - 0x3f);
    if (uVar16 - 0x3f < 0xffffffc2) goto LAB_001495ce;
    r = (secp256k1_fe *)((ulong)(0xfL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
    uVar16 = -(iVar4 * (((int)psVar21 * 2 + 2U & 8) + (int)psVar21)) & (uint)r;
    unaff_RBP = psVar31;
    psVar12 = psVar30;
    psVar24 = psVar33;
    psVar33 = psVar21;
LAB_00149294:
    uVar28 = (ulong)uVar16;
    a_01 = (secp256k1_fe *)(uVar28 * (long)psVar33);
    uVar32 = (long)a_01->n + (long)psVar24->n;
    psVar31 = (secp256k1_fe *)((long)unaff_RBP->n + (long)psVar27 * uVar28);
    psVar17 = (secp256k1_modinv64_signed62 *)(uVar28 * (long)psVar5);
    psVar30 = (secp256k1_fe *)((long)psVar17->v + (long)psVar12->n);
    psVar21 = psVar33;
    if ((uVar32 & (ulong)r) != 0) {
LAB_001495c9:
      pcStack_148 = (code *)0x1495ce;
      secp256k1_modinv64_var_cold_4();
      psVar21 = psVar33;
LAB_001495ce:
      pcStack_148 = (code *)0x1495d3;
      secp256k1_modinv64_var_cold_3();
LAB_001495d3:
      pcStack_148 = (code *)0x1495d8;
      secp256k1_modinv64_var_cold_5();
      psVar18 = unaff_R12;
      goto LAB_001495d8;
    }
  }
  a_01 = (secp256k1_fe *)((long)psVar5 * (long)psVar31);
  psVar17 = SUB168(SEXT816((long)psVar5) * SEXT816((long)psVar31),8);
  sStack_c0.u = (int64_t)psVar27;
  sStack_c0.v = (int64_t)psVar5;
  sStack_c0.q = (int64_t)psVar31;
  sStack_c0.r = (int64_t)psVar30;
  if ((long)psVar27 * (long)psVar30 - (long)a_01 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar27) * SEXT816((long)psVar30),8) - (long)psVar17 !=
      (ulong)((secp256k1_fe *)((long)psVar27 * (long)psVar30) < a_01)) goto LAB_0014960f;
  pcStack_148 = (code *)0x149322;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)&sStack_a0,&sStack_70,&sStack_c0,
             (secp256k1_modinv64_modinfo *)apsStack_130[1]);
  uVar20 = uStack_13c;
  psVar26 = &sStack_120;
  r = (secp256k1_fe *)(ulong)uStack_13c;
  psVar27 = (secp256k1_fe *)(ulong)uStack_13c;
  psVar17 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
  pcStack_148 = (code *)0x14933f;
  a_01 = psVar26;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar26,uStack_13c,
                     (secp256k1_modinv64_signed62 *)psVar18,-1);
  psVar21 = &sStack_f0;
  if (0 < iVar4) {
    psVar17 = (secp256k1_modinv64_signed62 *)0x1;
    psVar27 = (secp256k1_fe *)(ulong)uVar20;
    pcStack_148 = (code *)0x14935e;
    a_01 = psVar26;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar26,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (0 < iVar4) goto LAB_001495dd;
    psVar27 = (secp256k1_fe *)(ulong)uVar20;
    psVar17 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_148 = (code *)0x14937a;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,-1);
    if (iVar4 < 1) goto LAB_001495e2;
    psVar17 = (secp256k1_modinv64_signed62 *)0x1;
    psVar27 = (secp256k1_fe *)(ulong)uVar20;
    pcStack_148 = (code *)0x149394;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (-1 < iVar4) goto LAB_001495e7;
    pcStack_148 = (code *)0x1493b1;
    secp256k1_modinv64_update_fg_62_var
              (uVar20,(secp256k1_modinv64_signed62 *)psVar26,(secp256k1_modinv64_signed62 *)psVar21,
               &sStack_c0);
    if (sStack_f0.n[0] == 0) {
      if (1 < (int)uVar20) {
        uVar28 = 1;
        uVar8 = 0;
        do {
          uVar8 = uVar8 | sStack_f0.n[uVar28];
          uVar28 = uVar28 + 1;
        } while (uVar20 != uVar28);
        if (uVar8 != 0) goto LAB_001493e1;
      }
      a_01 = &sStack_f0;
      psVar27 = (secp256k1_fe *)(ulong)uVar20;
      psVar17 = (secp256k1_modinv64_signed62 *)0x0;
      pcStack_148 = (code *)0x1494c7;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,uVar20,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 != 0) goto LAB_00149605;
      pcStack_148 = (code *)0x1494e9;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_120,uVar20,&SECP256K1_SIGNED62_ONE,
                         -1);
      psVar26 = apsStack_130[0];
      if (iVar4 != 0) {
        pcStack_148 = (code *)0x14950a;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)&sStack_120,uVar20,&SECP256K1_SIGNED62_ONE
                           ,1);
        if (iVar4 != 0) {
          psVar27 = (secp256k1_fe *)0x5;
          psVar17 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_148 = (code *)0x149524;
          a_01 = psVar26;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar26,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_0014960a;
          a_01 = &sStack_a0;
          psVar27 = (secp256k1_fe *)0x5;
          psVar17 = (secp256k1_modinv64_signed62 *)0x0;
          pcStack_148 = (code *)0x149547;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_0014960a;
          a_01 = &sStack_120;
          psVar17 = (secp256k1_modinv64_signed62 *)0x1;
          psVar27 = (secp256k1_fe *)(ulong)uVar20;
          pcStack_148 = (code *)0x149563;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,uVar20,
                             (secp256k1_modinv64_signed62 *)psVar18,1);
          if (iVar4 != 0) goto LAB_0014960a;
        }
      }
      pcStack_148 = (code *)0x149586;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)&sStack_a0,
                 (int64_t)apsStack_130[(long)(int)uVar20 + 1],(secp256k1_modinv64_modinfo *)psVar18)
      ;
      psVar26->n[4] = sStack_a0.n[4];
      psVar26->n[2] = sStack_a0.n[2];
      psVar26->n[3] = sStack_a0.n[3];
      psVar26->n[0] = sStack_a0.n[0];
      psVar26->n[1] = sStack_a0.n[1];
      return;
    }
LAB_001493e1:
    lVar22 = (long)(int)uVar20;
    psVar5 = apsStack_130[lVar22 + 1];
    psVar17 = (secp256k1_modinv64_signed62 *)sStack_120.n[lVar22 + 5];
    a_01 = (secp256k1_fe *)((long)psVar5 >> 0x3f ^ (ulong)psVar5 | lVar22 + -2 >> 0x3f);
    psVar27 = (secp256k1_fe *)((long)psVar17 >> 0x3f ^ (ulong)psVar17 | (ulong)a_01);
    if (psVar27 == (secp256k1_fe *)0x0) {
      r = (secp256k1_fe *)(ulong)(uVar20 - 1);
      apsStack_130[lVar22] = (secp256k1_fe *)((ulong)apsStack_130[lVar22] | (long)psVar5 << 0x3e);
      psVar17 = (secp256k1_modinv64_signed62 *)((long)psVar17 << 0x3e);
      sStack_120.n[lVar22 + 4] = sStack_120.n[lVar22 + 4] | (ulong)psVar17;
    }
    if ((int)uStack_138 == 0xb) goto LAB_001495ec;
    uVar20 = (uint)r;
    psVar17 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_148 = (code *)0x149445;
    psVar27 = r;
    a_01 = psVar26;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar26,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,-1);
    if (iVar4 < 1) goto LAB_001495f1;
    psVar17 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_148 = (code *)0x14945f;
    psVar27 = r;
    a_01 = psVar26;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar26,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (0 < iVar4) goto LAB_001495f6;
    psVar17 = (secp256k1_modinv64_signed62 *)0xffffffffffffffff;
    pcStack_148 = (code *)0x14947b;
    psVar27 = r;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,-1);
    if (iVar4 < 1) goto LAB_001495fb;
    psVar17 = (secp256k1_modinv64_signed62 *)0x1;
    pcStack_148 = (code *)0x149495;
    psVar27 = r;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (-1 < iVar4) goto LAB_00149600;
    uStack_138 = (ulong)((int)uStack_138 + 1);
    unaff_R12 = psVar18;
    uStack_13c = uVar20;
    goto LAB_00149138;
  }
LAB_001495d8:
  pcStack_148 = (code *)0x1495dd;
  secp256k1_modinv64_var_cold_20();
LAB_001495dd:
  pcStack_148 = (code *)0x1495e2;
  secp256k1_modinv64_var_cold_19();
LAB_001495e2:
  pcStack_148 = (code *)0x1495e7;
  secp256k1_modinv64_var_cold_18();
LAB_001495e7:
  pcStack_148 = (code *)0x1495ec;
  secp256k1_modinv64_var_cold_17();
LAB_001495ec:
  pcStack_148 = (code *)0x1495f1;
  secp256k1_modinv64_var_cold_14();
LAB_001495f1:
  pcStack_148 = (code *)0x1495f6;
  secp256k1_modinv64_var_cold_13();
LAB_001495f6:
  pcStack_148 = (code *)0x1495fb;
  secp256k1_modinv64_var_cold_12();
LAB_001495fb:
  pcStack_148 = (code *)0x149600;
  secp256k1_modinv64_var_cold_11();
LAB_00149600:
  pcStack_148 = (code *)0x149605;
  secp256k1_modinv64_var_cold_10();
LAB_00149605:
  pcStack_148 = (code *)0x14960a;
  secp256k1_modinv64_var_cold_15();
LAB_0014960a:
  pcStack_148 = (code *)0x14960f;
  secp256k1_modinv64_var_cold_16();
  unaff_R12 = psVar18;
LAB_0014960f:
  pcStack_148 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  puVar11 = psVar27->n;
  if (*puVar11 >> 0x3e == 0) {
    uVar28 = psVar27->n[1];
    if (0x3fffffffffffffff < uVar28) goto LAB_0014969e;
    psVar17 = (secp256k1_modinv64_signed62 *)psVar27->n[2];
    if ((secp256k1_modinv64_signed62 *)0x3fffffffffffffff < psVar17) goto LAB_001496a3;
    uVar8 = psVar27->n[3];
    if (0x3fffffffffffffff < uVar8) goto LAB_001496a8;
    psVar27 = (secp256k1_fe *)psVar27->n[4];
    if (psVar27 < (secp256k1_fe *)0x100) {
      a_01->n[0] = uVar28 << 0x3e | *puVar11;
      a_01->n[1] = (long)psVar17 << 0x3c | uVar28 >> 2;
      a_01->n[2] = uVar8 << 0x3a | (ulong)psVar17 >> 4;
      a_01->n[3] = (long)psVar27 << 0x38 | uVar8 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    psStack_150 = (secp256k1_fe *)0x14969e;
    secp256k1_scalar_from_signed62_cold_5();
LAB_0014969e:
    psStack_150 = (secp256k1_fe *)0x1496a3;
    secp256k1_scalar_from_signed62_cold_4();
LAB_001496a3:
    psStack_150 = (secp256k1_fe *)0x1496a8;
    secp256k1_scalar_from_signed62_cold_3();
LAB_001496a8:
    psStack_150 = (secp256k1_fe *)0x1496ad;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_150 = (secp256k1_fe *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_150 = unaff_RBP;
  lStack_158 = lVar38;
  psStack_160 = psVar26;
  psStack_168 = psVar21;
  psStack_170 = unaff_R12;
  psStack_178 = r;
  uVar32 = a_01->n[0];
  uStack_198 = a_01->n[1];
  uStack_1a0 = a_01->n[2];
  uStack_1a8 = a_01->n[3];
  uStack_1b8 = a_01->n[4];
  uVar1 = psVar27->n[0];
  psStack_180 = (secp256k1_fe *)psVar27->n[1];
  uVar2 = psVar27->n[2];
  uStack_1e0 = *extraout_RDX;
  psStack_1d8 = (secp256k1_fe *)extraout_RDX[1];
  uStack_1f0 = extraout_RDX[2];
  psStack_1e8 = (secp256k1_fe *)extraout_RDX[3];
  uStack_188 = psVar27->n[3];
  uStack_1c0 = psVar27->n[4];
  uVar28 = 5;
  psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
  psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149748;
  psVar21 = a_01;
  iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar17,-2);
  psVar26 = psVar27;
  if (iVar4 < 1) {
LAB_0014a1ed:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a1f2;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_0014a1f2:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a1f7;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_0014a1f7:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a1fc;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_0014a1fc:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a201;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_0014a201:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a206;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar39 = psVar17;
LAB_0014a206:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a20b;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_0014a20b:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a210;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar17 = psVar39;
LAB_0014a210:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a215;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_0014a215:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a21a;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_0014a21a:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a21f;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_0014a21f:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a224;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_0014a224:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a229;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_0014a229:
    psVar5 = psVar21;
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a22e;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_0014a22e:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a233;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_0014a233:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a238;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_0014a238:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a23d;
    secp256k1_modinv64_update_de_62_cold_9();
    psVar21 = psVar5;
LAB_0014a23d:
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a242;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar18 = (secp256k1_fe *)0x1;
    uVar28 = 5;
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14976a;
    psVar21 = a_01;
    psStack_1b0 = a_01;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a_01,5,psVar17,1);
    if (-1 < iVar4) goto LAB_0014a1f2;
    uVar28 = 5;
    psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149789;
    psVar21 = psVar27;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar27,5,psVar17,-2);
    if (iVar4 < 1) goto LAB_0014a1f7;
    psVar18 = (secp256k1_fe *)0x1;
    uVar28 = 5;
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x1497a6;
    psVar21 = psVar27;
    iVar4 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)psVar27,5,psVar17,1);
    if (-1 < iVar4) goto LAB_0014a1fc;
    psVar26 = (secp256k1_fe *)0x3fffffffffffffff;
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x1497cc;
    psStack_1c8 = psVar27;
    uStack_190 = uVar2;
    iVar6 = secp256k1_modinv64_abs(uStack_1e0);
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x1497d9;
    psVar21 = psStack_1d8;
    iVar7 = secp256k1_modinv64_abs((int64_t)psStack_1d8);
    psVar18 = (secp256k1_fe *)(0x4000000000000000 - iVar7);
    if ((long)psVar18 < iVar6) goto LAB_0014a201;
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x1497f4;
    iVar6 = secp256k1_modinv64_abs(uStack_1f0);
    psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149801;
    psVar21 = psStack_1e8;
    iVar7 = secp256k1_modinv64_abs((int64_t)psStack_1e8);
    psVar18 = (secp256k1_fe *)(0x4000000000000000 - iVar7);
    psVar39 = psVar17;
    if ((long)psVar18 < iVar6) goto LAB_0014a206;
    uVar28 = uStack_1e0 * uVar32;
    psVar18 = SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uVar32),8);
    uVar8 = (long)psStack_1d8 * uVar1;
    psVar21 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uVar1),8);
    a_01 = (secp256k1_fe *)0x7fffffffffffffff;
    lVar38 = (0x7fffffffffffffff - (long)psVar21) - (long)psVar18;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar21,(long)psVar18) !=
        SBORROW8(lVar38,(ulong)(~uVar8 < uVar28))) != (long)(lVar38 - (ulong)(~uVar8 < uVar28)) < 0
        && -1 < (long)psVar21) goto LAB_0014a23d;
    psVar27 = (secp256k1_fe *)(uVar8 + uVar28);
    psVar21 = (secp256k1_fe *)((long)psVar18->n + (ulong)CARRY8(uVar8,uVar28) + (long)psVar21->n);
    uVar9 = uStack_1f0 * uVar32;
    lVar22 = SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uVar32),8);
    uVar10 = (long)psStack_1e8 * uVar1;
    lVar23 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uVar1),8);
    uVar8 = (ulong)(-uVar10 - 1 < uVar9);
    lVar38 = (0x7fffffffffffffff - lVar23) - lVar22;
    bVar40 = (SBORROW8(0x7fffffffffffffff - lVar23,lVar22) != SBORROW8(lVar38,uVar8)) !=
             (long)(lVar38 - uVar8) < 0;
    psVar18 = (secp256k1_fe *)CONCAT71((int7)(-uVar10 - 1 >> 8),bVar40 && -1 < lVar23);
    if (!bVar40 || -1 >= lVar23) {
      psVar39 = (secp256k1_modinv64_signed62 *)((long)uStack_1b8 >> 0x3f);
      psVar18 = (secp256k1_fe *)((long)uStack_1c0 >> 0x3f);
      lVar29 = ((ulong)psStack_1d8 & (ulong)psVar18) + (uStack_1e0 & (ulong)psVar39);
      psVar30 = (secp256k1_fe *)(uVar10 + uVar9);
      lVar22 = lVar23 + lVar22 + (ulong)CARRY8(uVar10,uVar9);
      lVar38 = psVar17->v[0];
      uVar8 = psVar17[1].v[0];
      uVar28 = lVar29 - (uVar8 * (long)psVar27 + lVar29 & 0x3fffffffffffffff);
      puVar11 = (uint64_t *)(uVar28 * lVar38);
      psVar5 = SUB168(SEXT816((long)uVar28) * SEXT816(lVar38),8);
      psStack_1d0 = psVar17;
      if (-1 < (long)psVar5) {
        uVar9 = (ulong)((secp256k1_fe *)(-(long)puVar11 - 1U) < psVar27);
        lVar23 = (0x7fffffffffffffff - (long)psVar5) - (long)psVar21;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar5,(long)psVar21) != SBORROW8(lVar23,uVar9)) ==
            (long)(lVar23 - uVar9) < 0) goto LAB_0014992f;
LAB_00149af0:
        psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149af5;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00149af5:
        lVar29 = (-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0);
        lVar23 = lVar22 - lVar29;
        if ((SBORROW8(lVar22,lVar29) != SBORROW8(lVar23,(ulong)(psVar30 < (secp256k1_fe *)-uVar8)))
            == (long)(lVar23 - (ulong)(psVar30 < (secp256k1_fe *)-uVar8)) < 0) goto LAB_0014997f;
LAB_00149b17:
        psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149b1c;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar9 = extraout_RAX;
        lVar22 = extraout_RDX_00;
LAB_00149b1c:
        psVar31 = (secp256k1_fe *)((-0x8000000000000000 - lVar22) - (ulong)(uVar9 != 0));
        psVar21 = (secp256k1_fe *)
                  (((long)psVar27 - (long)psVar31) - (ulong)(psVar30 < (secp256k1_fe *)-uVar9));
        if ((SBORROW8((long)psVar27,(long)psVar31) !=
            SBORROW8((long)psVar27 - (long)psVar31,(ulong)(psVar30 < (secp256k1_fe *)-uVar9))) ==
            (long)psVar21 < 0) {
LAB_00149a02:
          uVar8 = uVar8 >> 0x3e | lVar38 << 2;
          bVar40 = CARRY8((ulong)psVar30,uVar9);
          psVar30 = (secp256k1_fe *)((long)psVar30->n + uVar9);
          psVar27 = (secp256k1_fe *)((long)psVar27->n + (ulong)bVar40 + lVar22);
          psVar31 = (secp256k1_fe *)(uStack_1f0 * uStack_198 + uVar8);
          psVar21 = (secp256k1_fe *)
                    (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_198),8) +
                     (lVar38 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_198,uVar8));
          uVar8 = (long)psStack_1e8 * (long)psVar5;
          lVar38 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)psVar5),8);
          if (lVar38 < 0) goto LAB_00149b46;
          uVar9 = (ulong)((secp256k1_fe *)(-1 - uVar8) < psVar31);
          lVar22 = (0x7fffffffffffffff - lVar38) - (long)psVar21;
          psVar17 = (secp256k1_modinv64_signed62 *)(lVar22 - uVar9);
          if ((SBORROW8(0x7fffffffffffffff - lVar38,(long)psVar21) != SBORROW8(lVar22,uVar9)) !=
              (long)psVar17 < 0) goto LAB_00149b5e;
        }
        else {
LAB_00149b41:
          psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149b46;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar8 = extraout_RAX_00;
          lVar38 = extraout_RDX_01;
LAB_00149b46:
          psVar17 = (secp256k1_modinv64_signed62 *)
                    ((-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0));
          if ((SBORROW8((long)psVar21,(long)psVar17) !=
              SBORROW8((long)psVar21 - (long)psVar17,(ulong)(psVar31 < (secp256k1_fe *)-uVar8))) !=
              (long)(((long)psVar21 - (long)psVar17) - (ulong)(psVar31 < (secp256k1_fe *)-uVar8)) <
              0) {
LAB_00149b5e:
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149b63;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_00149b69;
          }
        }
        bVar40 = CARRY8((ulong)psVar31,uVar8);
        psVar31 = (secp256k1_fe *)((long)psVar31->n + uVar8);
        psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar40 + lVar38);
        psVar33 = (secp256k1_fe *)psStack_1d0->v[1];
        psVar17 = psStack_1d0;
        if (psVar33 == (secp256k1_fe *)0x0) goto LAB_00149b69;
        psVar12 = (secp256k1_fe *)((long)psVar33 * uVar28);
        psVar24 = SUB168(SEXT816((long)psVar33) * SEXT816((long)uVar28),8);
        if ((long)psVar24 < 0) goto LAB_0014a103;
        uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar12 - 1U) < psVar30);
        lVar38 = (0x7fffffffffffffff - (long)psVar24) - (long)psVar27;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar24,(long)psVar27) != SBORROW8(lVar38,uVar8))
            != (long)(lVar38 - uVar8) < 0) goto LAB_0014a125;
LAB_00149a9c:
        bVar40 = CARRY8((ulong)psVar12,(ulong)psVar30);
        psVar12 = (secp256k1_fe *)((long)psVar30->n + (long)psVar12->n);
        psVar24 = (secp256k1_fe *)((long)psVar27->n + (ulong)bVar40 + (long)psVar24->n);
        uVar8 = (long)psVar33 * (long)psVar18;
        lVar38 = SUB168(SEXT816((long)psVar33) * SEXT816((long)psVar18),8);
        if (lVar38 < 0) goto LAB_0014a12a;
        psVar27 = (secp256k1_fe *)(-1 - uVar8);
        lVar22 = ((long)a_01 - lVar38) - (long)psVar21;
        psVar30 = (secp256k1_fe *)(lVar22 - (ulong)(psVar27 < psVar31));
        if ((SBORROW8((long)a_01 - lVar38,(long)psVar21) !=
            SBORROW8(lVar22,(ulong)(psVar27 < psVar31))) != (long)psVar30 < 0) goto LAB_0014a14c;
LAB_00149acd:
        bVar40 = CARRY8((ulong)psVar31,uVar8);
        psVar31 = (secp256k1_fe *)((long)psVar31->n + uVar8);
        psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar40 + lVar38);
        psVar27 = psVar24;
        psVar30 = psVar12;
LAB_00149b69:
        psVar24 = psStack_1b0;
        uVar8 = (long)psVar27 << 2 | (ulong)psVar30 >> 0x3e;
        psVar5 = (secp256k1_fe *)(uStack_1e0 * uStack_1a0 + uVar8);
        psVar33 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_1a0),8) +
                   ((long)psVar27 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_1a0,uVar8));
        psStack_1b0->n[0] = (ulong)psVar30 & 0x3fffffffffffffff;
        uVar8 = (long)psStack_1d8 * uStack_190;
        lVar38 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uStack_190),8);
        psStack_1c8->n[0] = (ulong)psVar31 & 0x3fffffffffffffff;
        if (lVar38 < 0) {
          psVar30 = (secp256k1_fe *)((-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0));
          psVar27 = (secp256k1_fe *)
                    (((long)psVar33 - (long)psVar30) - (ulong)(psVar5 < (secp256k1_fe *)-uVar8));
          if ((SBORROW8((long)psVar33,(long)psVar30) !=
              SBORROW8((long)psVar33 - (long)psVar30,(ulong)(psVar5 < (secp256k1_fe *)-uVar8))) !=
              (long)psVar27 < 0) goto LAB_00149cc7;
LAB_00149bd7:
          uVar9 = (ulong)psVar31 >> 0x3e | (long)psVar21 << 2;
          bVar40 = CARRY8((ulong)psVar5,uVar8);
          psVar5 = (secp256k1_fe *)((long)psVar5->n + uVar8);
          psVar33 = (secp256k1_fe *)((long)psVar33->n + (ulong)bVar40 + lVar38);
          psVar30 = (secp256k1_fe *)(uStack_1f0 * uStack_1a0 + uVar9);
          psVar27 = (secp256k1_fe *)
                    (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_1a0),8) +
                     ((long)psVar21 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_1a0,uVar9));
          uVar8 = (long)psStack_1e8 * uStack_190;
          lVar38 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uStack_190),8);
          if (lVar38 < 0) goto LAB_00149ccc;
          uVar9 = (ulong)((secp256k1_fe *)(-1 - uVar8) < psVar30);
          lVar22 = ((long)a_01 - lVar38) - (long)psVar27;
          if ((SBORROW8((long)a_01 - lVar38,(long)psVar27) != SBORROW8(lVar22,uVar9)) !=
              (long)(lVar22 - uVar9) < 0) goto LAB_00149cee;
        }
        else {
          psVar27 = (secp256k1_fe *)(-1 - uVar8);
          lVar22 = ((long)a_01 - lVar38) - (long)psVar33;
          psVar30 = (secp256k1_fe *)(lVar22 - (ulong)(psVar27 < psVar5));
          if ((SBORROW8((long)a_01 - lVar38,(long)psVar33) !=
              SBORROW8(lVar22,(ulong)(psVar27 < psVar5))) == (long)psVar30 < 0) goto LAB_00149bd7;
LAB_00149cc7:
          psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149ccc;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar8 = extraout_RAX_01;
          lVar38 = extraout_RDX_02;
LAB_00149ccc:
          lVar23 = (-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0);
          lVar22 = (long)psVar27 - lVar23;
          if ((SBORROW8((long)psVar27,lVar23) !=
              SBORROW8(lVar22,(ulong)(psVar30 < (secp256k1_fe *)-uVar8))) !=
              (long)(lVar22 - (ulong)(psVar30 < (secp256k1_fe *)-uVar8)) < 0) {
LAB_00149cee:
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149cf3;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_00149cf9;
          }
        }
        bVar40 = CARRY8((ulong)psVar30,uVar8);
        psVar30 = (secp256k1_fe *)((long)psVar30->n + uVar8);
        psVar27 = (secp256k1_fe *)((long)psVar27->n + (ulong)bVar40 + lVar38);
        psVar12 = (secp256k1_fe *)psVar17->v[2];
        if (psVar12 == (secp256k1_fe *)0x0) goto LAB_00149cf9;
        psVar21 = (secp256k1_fe *)((long)psVar12 * uVar28);
        psVar31 = SUB168(SEXT816((long)psVar12) * SEXT816((long)uVar28),8);
        if ((long)psVar31 < 0) goto LAB_0014a151;
        uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar21 - 1U) < psVar5);
        lVar38 = ((long)a_01 - (long)psVar31) - (long)psVar33;
        psVar35 = psVar5;
        if ((SBORROW8((long)a_01 - (long)psVar31,(long)psVar33) != SBORROW8(lVar38,uVar8)) !=
            (long)(lVar38 - uVar8) < 0) goto LAB_0014a173;
LAB_00149c6c:
        bVar40 = CARRY8((ulong)psVar21,(ulong)psVar35);
        psVar21 = (secp256k1_fe *)((long)psVar35->n + (long)psVar21->n);
        psVar31 = (secp256k1_fe *)((long)psVar33->n + (ulong)bVar40 + (long)psVar31->n);
        uVar8 = (long)psVar12 * (long)psVar18;
        lVar38 = SUB168(SEXT816((long)psVar12) * SEXT816((long)psVar18),8);
        if (lVar38 < 0) goto LAB_0014a178;
        psVar34 = (secp256k1_fe *)(-1 - uVar8);
        lVar22 = ((long)a_01 - lVar38) - (long)psVar27;
        psVar17 = (secp256k1_modinv64_signed62 *)(lVar22 - (ulong)(psVar34 < psVar30));
        psVar5 = psVar21;
        psVar33 = psVar31;
        if ((SBORROW8((long)a_01 - lVar38,(long)psVar27) !=
            SBORROW8(lVar22,(ulong)(psVar34 < psVar30))) != (long)psVar17 < 0) goto LAB_0014a19a;
LAB_00149c9d:
        bVar40 = CARRY8((ulong)psVar30,uVar8);
        psVar30 = (secp256k1_fe *)((long)psVar30->n + uVar8);
        psVar27 = (secp256k1_fe *)((long)psVar27->n + (ulong)bVar40 + lVar38);
LAB_00149cf9:
        uVar8 = (long)psVar33 << 2 | (ulong)psVar5 >> 0x3e;
        psVar35 = (secp256k1_fe *)(uStack_1e0 * uStack_1a8 + uVar8);
        psVar34 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_1a8),8) +
                   ((long)psVar33 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_1a8,uVar8));
        psVar24->n[1] = (ulong)psVar5 & 0x3fffffffffffffff;
        uVar8 = (long)psStack_1d8 * uStack_188;
        lVar38 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uStack_188),8);
        psStack_1c8->n[1] = (ulong)psVar30 & 0x3fffffffffffffff;
        if (lVar38 < 0) {
          uVar9 = (-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0);
          psVar21 = (secp256k1_fe *)
                    (((long)psVar34 - uVar9) - (ulong)(psVar35 < (secp256k1_fe *)-uVar8));
          if ((SBORROW8((long)psVar34,uVar9) !=
              SBORROW8((long)psVar34 - uVar9,(ulong)(psVar35 < (secp256k1_fe *)-uVar8))) !=
              (long)psVar21 < 0) goto LAB_00149dcf;
LAB_00149d65:
          uVar10 = (ulong)psVar30 >> 0x3e | (long)psVar27 << 2;
          bVar40 = CARRY8((ulong)psVar35,uVar8);
          psVar35 = (secp256k1_fe *)((long)psVar35->n + uVar8);
          psVar34 = (secp256k1_fe *)((long)psVar34->n + (ulong)bVar40 + lVar38);
          uVar9 = uStack_1f0 * uStack_1a8 + uVar10;
          psVar21 = (secp256k1_fe *)
                    (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_1a8),8) +
                     ((long)psVar27 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_1a8,uVar10));
          uVar8 = (long)psStack_1e8 * uStack_188;
          lVar38 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uStack_188),8);
          if (lVar38 < 0) goto LAB_00149dd4;
          uVar10 = (ulong)(-uVar8 - 1 < uVar9);
          lVar22 = ((long)a_01 - lVar38) - (long)psVar21;
          bVar40 = SBORROW8((long)a_01 - lVar38,(long)psVar21) != SBORROW8(lVar22,uVar10);
          lVar22 = lVar22 - uVar10;
        }
        else {
          psVar21 = (secp256k1_fe *)(-1 - uVar8);
          lVar22 = ((long)a_01 - lVar38) - (long)psVar34;
          uVar9 = lVar22 - (ulong)(psVar21 < psVar35);
          if ((SBORROW8((long)a_01 - lVar38,(long)psVar34) !=
              SBORROW8(lVar22,(ulong)(psVar21 < psVar35))) == (long)uVar9 < 0) goto LAB_00149d65;
LAB_00149dcf:
          psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149dd4;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar8 = extraout_RAX_02;
          lVar38 = extraout_RDX_03;
LAB_00149dd4:
          lVar23 = (-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0);
          lVar22 = (long)psVar21 - lVar23;
          bVar40 = SBORROW8((long)psVar21,lVar23) != SBORROW8(lVar22,(ulong)(uVar9 < -uVar8));
          lVar22 = lVar22 - (ulong)(uVar9 < -uVar8);
        }
        psVar17 = (secp256k1_modinv64_signed62 *)0x8000000000000000;
        if (bVar40 != lVar22 < 0) goto LAB_0014a215;
        psVar31 = (secp256k1_fe *)(uVar9 + uVar8);
        psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)CARRY8(uVar9,uVar8) + lVar38);
        psVar27 = (secp256k1_fe *)psStack_1d0->v[3];
        if (psVar27 == (secp256k1_fe *)0x0) goto LAB_00149e73;
        psVar12 = (secp256k1_fe *)((long)psVar27 * uVar28);
        psVar24 = SUB168(SEXT816((long)psVar27) * SEXT816((long)uVar28),8);
        if ((long)psVar24 < 0) goto LAB_0014a19f;
        uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar12 - 1U) < psVar35);
        lVar38 = ((long)a_01 - (long)psVar24) - (long)psVar34;
        if ((SBORROW8((long)a_01 - (long)psVar24,(long)psVar34) != SBORROW8(lVar38,uVar8)) !=
            (long)(lVar38 - uVar8) < 0) goto LAB_0014a1c1;
LAB_00149e34:
        bVar40 = CARRY8((ulong)psVar12,(ulong)psVar35);
        psVar12 = (secp256k1_fe *)((long)psVar35->n + (long)psVar12->n);
        psVar24 = (secp256k1_fe *)((long)psVar34->n + (ulong)bVar40 + (long)psVar24->n);
        uVar8 = (long)psVar27 * (long)psVar18;
        lVar38 = SUB168(SEXT816((long)psVar27) * SEXT816((long)psVar18),8);
        if (lVar38 < 0) goto LAB_0014a1c6;
        uVar9 = (ulong)((secp256k1_fe *)(-1 - uVar8) < psVar31);
        lVar22 = ((long)a_01 - lVar38) - (long)psVar21;
        psVar34 = psVar24;
        psVar35 = psVar12;
        if ((SBORROW8((long)a_01 - lVar38,(long)psVar21) != SBORROW8(lVar22,uVar9)) ==
            (long)(lVar22 - uVar9) < 0) {
          do {
            bVar40 = CARRY8((ulong)psVar31,uVar8);
            psVar31 = (secp256k1_fe *)((long)psVar31->n + uVar8);
            psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar40 + lVar38);
LAB_00149e73:
            psVar5 = psStack_1b0;
            uVar8 = (long)psVar34 << 2 | (ulong)psVar35 >> 0x3e;
            psVar35 = (secp256k1_fe *)((ulong)psVar35 & 0x3fffffffffffffff);
            psVar30 = (secp256k1_fe *)(uStack_1e0 * uStack_1b8 + uVar8);
            psVar27 = (secp256k1_fe *)
                      (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_1b8),8) +
                       ((long)psVar34 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_1b8,uVar8));
            psStack_1b0->n[2] = (uint64_t)psVar35;
            uVar8 = (long)psStack_1d8 * uStack_1c0;
            lVar38 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uStack_1c0),8);
            psStack_1c8->n[2] = (ulong)psVar31 & 0x3fffffffffffffff;
            if (lVar38 < 0) {
              lVar23 = (-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0);
              lVar22 = (long)psVar27 - lVar23;
              psVar33 = (secp256k1_fe *)(lVar22 - (ulong)(psVar30 < (secp256k1_fe *)-uVar8));
              if ((SBORROW8((long)psVar27,lVar23) !=
                  SBORROW8(lVar22,(ulong)(psVar30 < (secp256k1_fe *)-uVar8))) != (long)psVar33 < 0)
              goto LAB_00149f4d;
LAB_00149ee1:
              uVar9 = (ulong)psVar31 >> 0x3e | (long)psVar21 << 2;
              bVar40 = CARRY8((ulong)psVar30,uVar8);
              psVar30 = (secp256k1_fe *)((long)psVar30->n + uVar8);
              psVar27 = (secp256k1_fe *)((long)psVar27->n + (ulong)bVar40 + lVar38);
              psVar35 = (secp256k1_fe *)(uStack_1f0 * uStack_1b8 + uVar9);
              psVar33 = (secp256k1_fe *)
                        (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_1b8),8) +
                         ((long)psVar21 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_1b8,uVar9));
              uVar8 = (long)psStack_1e8 * uStack_1c0;
              lVar38 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uStack_1c0),8);
              if (lVar38 < 0) goto LAB_00149f52;
              psVar21 = (secp256k1_fe *)(-1 - uVar8);
              lVar22 = ((long)a_01 - lVar38) - (long)psVar33;
              bVar40 = SBORROW8((long)a_01 - lVar38,(long)psVar33) !=
                       SBORROW8(lVar22,(ulong)(psVar21 < psVar35));
              psVar31 = (secp256k1_fe *)(lVar22 - (ulong)(psVar21 < psVar35));
            }
            else {
              psVar33 = (secp256k1_fe *)(-1 - uVar8);
              lVar22 = ((long)a_01 - lVar38) - (long)psVar27;
              if ((SBORROW8((long)a_01 - lVar38,(long)psVar27) !=
                  SBORROW8(lVar22,(ulong)(psVar33 < psVar30))) ==
                  (long)(lVar22 - (ulong)(psVar33 < psVar30)) < 0) goto LAB_00149ee1;
LAB_00149f4d:
              psStack_1f8 = (secp256k1_modinv64_signed62 *)0x149f52;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar8 = extraout_RAX_03;
              lVar38 = extraout_RDX_04;
LAB_00149f52:
              lVar23 = (-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0);
              lVar22 = (long)psVar33 - lVar23;
              bVar40 = SBORROW8((long)psVar33,lVar23) !=
                       SBORROW8(lVar22,(ulong)(psVar35 < (secp256k1_fe *)-uVar8));
              psVar21 = (secp256k1_fe *)(lVar22 - (ulong)(psVar35 < (secp256k1_fe *)-uVar8));
              psVar31 = psVar21;
            }
            psVar17 = psStack_1d0;
            psVar24 = (secp256k1_fe *)0x8000000000000000;
            if (bVar40 != (long)psVar31 < 0) goto LAB_0014a21a;
            psVar12 = (secp256k1_fe *)((long)psVar35->n + uVar8);
            psVar33 = (secp256k1_fe *)
                      ((long)psVar33->n + (ulong)CARRY8((ulong)psVar35,uVar8) + lVar38);
            psVar31 = (secp256k1_fe *)psStack_1d0->v[4];
            psVar21 = (secp256k1_fe *)((long)psVar31 * uVar28);
            uVar28 = SUB168(SEXT816((long)psVar31) * SEXT816((long)uVar28),8);
            if ((long)uVar28 < 0) {
              lVar22 = (-0x8000000000000000 - uVar28) - (ulong)(psVar21 != (secp256k1_fe *)0x0);
              lVar38 = (long)psVar27 - lVar22;
              if ((SBORROW8((long)psVar27,lVar22) !=
                  SBORROW8(lVar38,(ulong)(psVar30 < (secp256k1_fe *)-(long)psVar21))) !=
                  (long)(lVar38 - (ulong)(psVar30 < (secp256k1_fe *)-(long)psVar21)) < 0)
              goto LAB_0014a0de;
LAB_00149fad:
              bVar40 = CARRY8((ulong)psVar21,(ulong)psVar30);
              psVar21 = (secp256k1_fe *)((long)psVar30->n + (long)psVar21->n);
              uVar28 = (long)psVar27->n + bVar40 + uVar28;
              uVar8 = (long)psVar31 * (long)psVar18;
              lVar38 = SUB168(SEXT816((long)psVar31) * SEXT816((long)psVar18),8);
              if (lVar38 < 0) goto LAB_0014a0e3;
              psVar18 = (secp256k1_fe *)(-uVar8 - 1);
              lVar22 = (long)a_01 - lVar38;
              lVar23 = lVar22 - (long)psVar33;
              a_01 = (secp256k1_fe *)(lVar23 - (ulong)(psVar18 < psVar12));
              if ((SBORROW8(lVar22,(long)psVar33) != SBORROW8(lVar23,(ulong)(psVar18 < psVar12))) ==
                  (long)a_01 < 0) goto LAB_00149fdb;
            }
            else {
              uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar21 - 1U) < psVar30);
              lVar38 = ((long)a_01 - uVar28) - (long)psVar27;
              if ((SBORROW8((long)a_01 - uVar28,(long)psVar27) != SBORROW8(lVar38,uVar8)) ==
                  (long)(lVar38 - uVar8) < 0) goto LAB_00149fad;
LAB_0014a0de:
              psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a0e3;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar8 = extraout_RAX_04;
              lVar38 = extraout_RDX_05;
LAB_0014a0e3:
              psVar27 = (secp256k1_fe *)((-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0));
              psVar18 = (secp256k1_fe *)
                        (((long)psVar33 - (long)psVar27) - (ulong)(psVar12 < (secp256k1_fe *)-uVar8)
                        );
              if ((SBORROW8((long)psVar33,(long)psVar27) !=
                  SBORROW8((long)psVar33 - (long)psVar27,(ulong)(psVar12 < (secp256k1_fe *)-uVar8)))
                  == (long)psVar18 < 0) {
LAB_00149fdb:
                a_01 = psStack_1c8;
                uVar9 = (long)psVar12->n + uVar8;
                lVar38 = (long)psVar33->n + (ulong)CARRY8(uVar8,(ulong)psVar12) + lVar38;
                psVar18 = (secp256k1_fe *)(uVar28 << 2 | (ulong)psVar21 >> 0x3e);
                psVar5->n[3] = (ulong)psVar21 & 0x3fffffffffffffff;
                psVar26 = (secp256k1_fe *)(uVar9 & 0x3fffffffffffffff);
                psStack_1c8->n[3] = (uint64_t)psVar26;
                psVar21 = (secp256k1_fe *)(psVar18[0x2aaaaaaaaaaaaaa].n + 2);
                uVar28 = ((long)uVar28 >> 0x3e) + -1 +
                         (ulong)((secp256k1_fe *)0x7fffffffffffffff < psVar18);
                if (uVar28 != 0xffffffffffffffff) goto LAB_0014a21f;
                uVar28 = 0xffffffffffffffff;
                uVar8 = uVar9 >> 0x3e | lVar38 * 4;
                psVar5->n[4] = (uint64_t)psVar18;
                if ((lVar38 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1)
                goto LAB_0014a224;
                psStack_1c8->n[4] = uVar8;
                uVar28 = 5;
                psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
                psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a053;
                psVar21 = psVar5;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar5,5,psVar17,-2);
                if (iVar4 < 1) goto LAB_0014a229;
                psVar18 = (secp256k1_fe *)0x1;
                uVar28 = 5;
                psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a070;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar5,5,psVar17,1);
                if (-1 < iVar4) goto LAB_0014a22e;
                uVar28 = 5;
                psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
                psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a08f;
                psVar5 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar17,-2);
                if (iVar4 < 1) goto LAB_0014a233;
                psVar18 = (secp256k1_fe *)0x1;
                uVar28 = 5;
                psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a0ac;
                psVar5 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,psVar17,1);
                if (iVar4 < 0) {
                  return;
                }
                goto LAB_0014a238;
              }
            }
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a103;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_0014a103:
            lVar22 = (-0x8000000000000000 - (long)psVar24) - (ulong)(psVar12 != (secp256k1_fe *)0x0)
            ;
            lVar38 = (long)psVar27 - lVar22;
            if ((SBORROW8((long)psVar27,lVar22) !=
                SBORROW8(lVar38,(ulong)(psVar30 < (secp256k1_fe *)-(long)psVar12))) ==
                (long)(lVar38 - (ulong)(psVar30 < (secp256k1_fe *)-(long)psVar12)) < 0)
            goto LAB_00149a9c;
LAB_0014a125:
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a12a;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar8 = extraout_RAX_05;
            lVar38 = extraout_RDX_06;
LAB_0014a12a:
            psVar30 = (secp256k1_fe *)((-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0));
            psVar27 = (secp256k1_fe *)
                      (((long)psVar21 - (long)psVar30) - (ulong)(psVar31 < (secp256k1_fe *)-uVar8));
            if ((SBORROW8((long)psVar21,(long)psVar30) !=
                SBORROW8((long)psVar21 - (long)psVar30,(ulong)(psVar31 < (secp256k1_fe *)-uVar8)))
                == (long)psVar27 < 0) goto LAB_00149acd;
LAB_0014a14c:
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a151;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_0014a151:
            lVar22 = (-0x8000000000000000 - (long)psVar31) - (ulong)(psVar21 != (secp256k1_fe *)0x0)
            ;
            lVar38 = (long)psVar33 - lVar22;
            psVar35 = psVar5;
            if ((SBORROW8((long)psVar33,lVar22) !=
                SBORROW8(lVar38,(ulong)(psVar5 < (secp256k1_fe *)-(long)psVar21))) ==
                (long)(lVar38 - (ulong)(psVar5 < (secp256k1_fe *)-(long)psVar21)) < 0)
            goto LAB_00149c6c;
LAB_0014a173:
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a178;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar8 = extraout_RAX_06;
            lVar38 = extraout_RDX_07;
            psVar35 = psVar5;
LAB_0014a178:
            psVar17 = (secp256k1_modinv64_signed62 *)
                      ((-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0));
            psVar34 = (secp256k1_fe *)
                      (((long)psVar27 - (long)psVar17) - (ulong)(psVar30 < (secp256k1_fe *)-uVar8));
            psVar5 = psVar21;
            psVar33 = psVar31;
            if ((SBORROW8((long)psVar27,(long)psVar17) !=
                SBORROW8((long)psVar27 - (long)psVar17,(ulong)(psVar30 < (secp256k1_fe *)-uVar8)))
                == (long)psVar34 < 0) goto LAB_00149c9d;
LAB_0014a19a:
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a19f;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_0014a19f:
            lVar22 = (-0x8000000000000000 - (long)psVar24) - (ulong)(psVar12 != (secp256k1_fe *)0x0)
            ;
            lVar38 = (long)psVar34 - lVar22;
            if ((SBORROW8((long)psVar34,lVar22) !=
                SBORROW8(lVar38,(ulong)(psVar35 < (secp256k1_fe *)-(long)psVar12))) ==
                (long)(lVar38 - (ulong)(psVar35 < (secp256k1_fe *)-(long)psVar12)) < 0)
            goto LAB_00149e34;
LAB_0014a1c1:
            psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a1c6;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar8 = extraout_RAX_07;
            lVar38 = extraout_RDX_08;
LAB_0014a1c6:
            lVar23 = (-0x8000000000000000 - lVar38) - (ulong)(uVar8 != 0);
            lVar22 = (long)psVar21 - lVar23;
            psVar34 = psVar24;
            psVar35 = psVar12;
            if ((SBORROW8((long)psVar21,lVar23) !=
                SBORROW8(lVar22,(ulong)(psVar31 < (secp256k1_fe *)-uVar8))) !=
                (long)(lVar22 - (ulong)(psVar31 < (secp256k1_fe *)-uVar8)) < 0) break;
          } while( true );
        }
        psStack_1f8 = (secp256k1_modinv64_signed62 *)0x14a1ed;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_0014a1ed;
      }
      lVar29 = (-0x8000000000000000 - (long)psVar5) - (ulong)(puVar11 != (uint64_t *)0x0);
      lVar23 = (long)psVar21 - lVar29;
      if ((SBORROW8((long)psVar21,lVar29) !=
          SBORROW8(lVar23,(ulong)(psVar27 < (secp256k1_fe *)-(long)puVar11))) !=
          (long)(lVar23 - (ulong)(psVar27 < (secp256k1_fe *)-(long)puVar11)) < 0) goto LAB_00149af0;
LAB_0014992f:
      psVar39 = (secp256k1_modinv64_signed62 *)((ulong)psVar39 & uStack_1f0);
      psVar18 = (secp256k1_fe *)
                ((long)psVar39 +
                (((ulong)psVar18 & (ulong)psStack_1e8) -
                ((long)psVar39->v + uVar8 * (long)psVar30 + ((ulong)psVar18 & (ulong)psStack_1e8) &
                0x3fffffffffffffff)));
      bVar40 = CARRY8((ulong)puVar11,(ulong)psVar27);
      puVar11 = (uint64_t *)((long)psVar27->n + (long)puVar11);
      psVar5 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar40 + (long)psVar5->n);
      uVar8 = (long)psVar18 * lVar38;
      lVar38 = SUB168(SEXT816((long)psVar18) * SEXT816(lVar38),8);
      if (lVar38 < 0) goto LAB_00149af5;
      uVar9 = (ulong)((secp256k1_fe *)(-uVar8 - 1) < psVar30);
      lVar23 = (0x7fffffffffffffff - lVar38) - lVar22;
      if ((SBORROW8(0x7fffffffffffffff - lVar38,lVar22) != SBORROW8(lVar23,uVar9)) !=
          (long)(lVar23 - uVar9) < 0) goto LAB_00149b17;
LAB_0014997f:
      bVar40 = CARRY8(uVar8,(ulong)psVar30);
      uVar8 = (long)psVar30->n + uVar8;
      lVar38 = lVar38 + lVar22 + (ulong)bVar40;
      if (((ulong)puVar11 & 0x3fffffffffffffff) != 0) goto LAB_0014a20b;
      psVar17 = psVar39;
      if ((uVar8 & 0x3fffffffffffffff) == 0) {
        uVar9 = (ulong)puVar11 >> 0x3e | (long)psVar5 << 2;
        psVar30 = (secp256k1_fe *)(uStack_1e0 * uStack_198 + uVar9);
        psVar27 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_198),8) +
                   ((long)psVar5 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_198,uVar9));
        uVar9 = (long)psStack_1d8 * (long)psStack_180;
        lVar22 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)psStack_180),8);
        psVar5 = psStack_180;
        if (lVar22 < 0) goto LAB_00149b1c;
        psVar21 = (secp256k1_fe *)(-1 - uVar9);
        lVar23 = (0x7fffffffffffffff - lVar22) - (long)psVar27;
        psVar31 = (secp256k1_fe *)(lVar23 - (ulong)(psVar21 < psVar30));
        if ((SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar27) !=
            SBORROW8(lVar23,(ulong)(psVar21 < psVar30))) != (long)psVar31 < 0) goto LAB_00149b41;
        goto LAB_00149a02;
      }
      goto LAB_0014a210;
    }
  }
  iVar4 = (int)uVar28;
  psStack_1f8 = (secp256k1_modinv64_signed62 *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  psVar39 = &sStack_258;
  psStack_208 = psVar26;
  psStack_200 = a_01;
  psStack_1f8 = psVar17;
  secp256k1_modinv64_mul_62(&sStack_230,(secp256k1_modinv64_signed62 *)psVar21,iVar4,1);
  psVar17 = a_00;
  secp256k1_modinv64_mul_62(&sStack_258,a_00,5,(int64_t)psVar18);
  lVar38 = 0;
  while ((ulong)sStack_230.v[lVar38] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_258.v[lVar38]) goto LAB_0014a2d7;
    lVar38 = lVar38 + 1;
    if (lVar38 == 4) {
      uVar20 = 4;
      while( true ) {
        if (sStack_230.v[uVar20] < sStack_258.v[uVar20]) {
          return;
        }
        if (sStack_258.v[uVar20] < sStack_230.v[uVar20]) break;
        bVar40 = uVar20 == 0;
        uVar20 = uVar20 - 1;
        if (bVar40) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_0014a2d7:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)psVar39;
  if (iVar4 < 1) {
LAB_0014a584:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0014a589:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_0014a58e:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0014a593:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0014a598:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_0014a59d:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar32 = psVar18->n[0];
    uVar1 = psVar18->n[1];
    lVar38 = psVar17->v[0];
    lVar22 = *extraout_RDX_09;
    uVar28 = lVar38 * uVar32;
    lVar29 = SUB168(SEXT816(lVar38) * SEXT816((long)uVar32),8);
    uVar8 = lVar22 * uVar1;
    lVar25 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar1),8);
    lVar23 = (0x7fffffffffffffff - lVar25) - lVar29;
    if ((SBORROW8(0x7fffffffffffffff - lVar25,lVar29) != SBORROW8(lVar23,(ulong)(~uVar8 < uVar28)))
        != (long)(lVar23 - (ulong)(~uVar8 < uVar28)) < 0 && -1 < lVar25) goto LAB_0014a59d;
    uVar2 = psVar18->n[2];
    uVar3 = psVar18->n[3];
    lVar29 = lVar25 + lVar29 + (ulong)CARRY8(uVar8,uVar28);
    uVar10 = lVar38 * uVar2;
    lVar23 = SUB168(SEXT816(lVar38) * SEXT816((long)uVar2),8);
    uVar13 = lVar22 * uVar3;
    lVar22 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar3),8);
    uVar9 = (ulong)(-uVar13 - 1 < uVar10);
    lVar38 = (0x7fffffffffffffff - lVar22) - lVar23;
    if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar23) != SBORROW8(lVar38,uVar9)) ==
        (long)(lVar38 - uVar9) < 0 || lVar22 < 0) {
      lVar38 = lVar22 + lVar23 + (ulong)CARRY8(uVar13,uVar10);
      if ((uVar8 + uVar28 & 0x3fffffffffffffff) != 0) goto LAB_0014a589;
      if ((uVar13 + uVar10 & 0x3fffffffffffffff) != 0) goto LAB_0014a58e;
      uVar9 = uVar13 + uVar10 >> 0x3e | lVar38 * 4;
      uVar28 = uVar8 + uVar28 >> 0x3e | lVar29 * 4;
      lVar38 = lVar38 >> 0x3e;
      lVar29 = lVar29 >> 0x3e;
      if (iVar4 != 1) {
        psVar39 = (secp256k1_modinv64_signed62 *)((ulong)psVar39 & 0xffffffff);
        psVar19 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar22 = psVar17->v[(long)psVar19];
          uVar10 = lVar22 * uVar32 + uVar28;
          lVar25 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar32),8) + lVar29 +
                   (ulong)CARRY8(lVar22 * uVar32,uVar28);
          lVar23 = extraout_RDX_09[(long)psVar19];
          uVar8 = lVar23 * uVar1;
          lVar29 = SUB168(SEXT816(lVar23) * SEXT816((long)uVar1),8);
          if (lVar29 < 0) {
            lVar36 = (-0x8000000000000000 - lVar29) - (ulong)(uVar8 != 0);
            lVar14 = lVar25 - lVar36;
            if ((SBORROW8(lVar25,lVar36) != SBORROW8(lVar14,(ulong)(uVar10 < -uVar8))) ==
                (long)(lVar14 - (ulong)(uVar10 < -uVar8)) < 0) goto LAB_0014a473;
LAB_0014a57a:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0014a57f:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0014a584;
          }
          uVar28 = (ulong)(-uVar8 - 1 < uVar10);
          lVar14 = (0x7fffffffffffffff - lVar29) - lVar25;
          if ((SBORROW8(0x7fffffffffffffff - lVar29,lVar25) != SBORROW8(lVar14,uVar28)) !=
              (long)(lVar14 - uVar28) < 0) goto LAB_0014a57a;
LAB_0014a473:
          lVar29 = lVar25 + lVar29 + (ulong)CARRY8(uVar10,uVar8);
          uVar37 = lVar22 * uVar2 + uVar9;
          lVar22 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar2),8) + lVar38 +
                   (ulong)CARRY8(lVar22 * uVar2,uVar9);
          uVar13 = lVar23 * uVar3;
          lVar38 = SUB168(SEXT816(lVar23) * SEXT816((long)uVar3),8);
          if (lVar38 < 0) {
            lVar25 = (-0x8000000000000000 - lVar38) - (ulong)(uVar13 != 0);
            lVar23 = lVar22 - lVar25;
            if ((SBORROW8(lVar22,lVar25) != SBORROW8(lVar23,(ulong)(uVar37 < -uVar13))) !=
                (long)(lVar23 - (ulong)(uVar37 < -uVar13)) < 0) goto LAB_0014a57f;
          }
          else {
            uVar28 = (ulong)(-uVar13 - 1 < uVar37);
            lVar23 = (0x7fffffffffffffff - lVar38) - lVar22;
            if ((SBORROW8(0x7fffffffffffffff - lVar38,lVar22) != SBORROW8(lVar23,uVar28)) !=
                (long)(lVar23 - uVar28) < 0) goto LAB_0014a57f;
          }
          lVar38 = lVar22 + lVar38 + (ulong)CARRY8(uVar37,uVar13);
          uVar28 = lVar29 * 4 | uVar10 + uVar8 >> 0x3e;
          psVar17->v[(long)((long)psVar19[-1].v + 0x27)] = uVar10 + uVar8 & 0x3fffffffffffffff;
          uVar9 = lVar38 * 4 | uVar37 + uVar13 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar19[-1].v + 0x27)] = uVar37 + uVar13 & 0x3fffffffffffffff
          ;
          psVar19 = (secp256k1_modinv64_signed62 *)((long)psVar19->v + 1);
          lVar38 = lVar38 >> 0x3e;
          lVar29 = lVar29 >> 0x3e;
        } while (psVar39 != psVar19);
      }
      if (lVar29 + -1 + (ulong)(0x7fffffffffffffff < uVar28) != -1) goto LAB_0014a593;
      psVar17->v[(long)iVar4 + -1] = uVar28;
      if (lVar38 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
        extraout_RDX_09[(long)iVar4 + -1] = uVar9;
        return;
      }
      goto LAB_0014a598;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar38 = psVar39->v[0];
  lVar22 = psVar39->v[1];
  lVar23 = psVar39->v[2];
  lVar29 = psVar39->v[3];
  lVar25 = psVar39->v[4];
  lVar14 = 0;
  do {
    if (psVar39->v[lVar14] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_0014a7d3:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014a7d8;
    }
    if (0x3fffffffffffffff < psVar39->v[lVar14]) goto LAB_0014a7d3;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(psVar39,5,b,-2);
  if (iVar4 < 1) {
LAB_0014a7d8:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014a7dd:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_0014a7e2:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar39,5,b,1);
    if (-1 < iVar4) goto LAB_0014a7dd;
    uVar28 = lVar25 >> 0x3f;
    uVar10 = (long)psVar17 >> 0x3f;
    uVar8 = ((uVar28 & b->v[0]) + lVar38 ^ uVar10) - uVar10;
    uVar13 = ((long)uVar8 >> 0x3e) + (((uVar28 & b->v[1]) + lVar22 ^ uVar10) - uVar10);
    uVar37 = ((long)uVar13 >> 0x3e) + ((lVar23 + (uVar28 & b->v[2]) ^ uVar10) - uVar10);
    uVar9 = ((long)uVar37 >> 0x3e) + (((uVar28 & b->v[3]) + lVar29 ^ uVar10) - uVar10);
    lVar38 = ((long)uVar9 >> 0x3e) + (((uVar28 & b->v[4]) + lVar25 ^ uVar10) - uVar10);
    uVar10 = lVar38 >> 0x3f;
    uVar28 = (b->v[0] & uVar10) + (uVar8 & 0x3fffffffffffffff);
    uVar13 = ((long)uVar28 >> 0x3e) + (b->v[1] & uVar10) + (uVar13 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar13 >> 0x3e) + (b->v[2] & uVar10) + (uVar37 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar8 >> 0x3e) + (b->v[3] & uVar10) + (uVar9 & 0x3fffffffffffffff);
    uVar10 = (b->v[4] & uVar10) + lVar38 + ((long)uVar9 >> 0x3e);
    psVar39->v[0] = uVar28 & 0x3fffffffffffffff;
    psVar39->v[1] = uVar13 & 0x3fffffffffffffff;
    psVar39->v[2] = uVar8 & 0x3fffffffffffffff;
    psVar39->v[3] = uVar9 & 0x3fffffffffffffff;
    psVar39->v[4] = uVar10;
    if (0x3fffffffffffffff < uVar10) goto LAB_0014a7e2;
    iVar4 = secp256k1_modinv64_mul_cmp_62(psVar39,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(psVar39,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_0014a7ec;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014a7ec:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(r->magnitude + a->magnitude <= 32);

    secp256k1_fe_impl_add(r, a);
    r->magnitude += a->magnitude;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}